

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferView.h
# Opt level: O0

void __thiscall Diligent::IBufferView::IBufferView(IBufferView *this)

{
  IBufferView *this_local;
  
  IDeviceObject::IDeviceObject(&this->super_IDeviceObject);
  (this->super_IDeviceObject).super_IObject._vptr_IObject =
       (_func_int **)&PTR___cxa_pure_virtual_010cdde0;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IBufferView, IDeviceObject)
{
#if DILIGENT_CPP_INTERFACE
    /// Returns the buffer view description used to create the object
    virtual const BufferViewDesc& METHOD(GetDesc)() const override = 0;
#endif

    /// Returns pointer to the referenced buffer object.

    /// The method does **NOT** increment the reference counter of the returned object,
    /// so Release() **must not** be called.
    VIRTUAL struct IBuffer* METHOD(GetBuffer)(THIS) CONST PURE;
}